

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle-allocator.hh
# Opt level: O1

bool __thiscall
tinyusdz::HandleAllocator<unsigned_long>::Has
          (HandleAllocator<unsigned_long> *this,unsigned_long handle)

{
  pointer puVar1;
  pointer puVar2;
  ulong *puVar3;
  ulong *puVar4;
  long lVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (this->dirty_ == true) {
    puVar1 = (this->freeList_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->freeList_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (puVar1 != puVar2) {
      uVar7 = (long)puVar2 - (long)puVar1 >> 3;
      lVar5 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar1,puVar2,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar1,puVar2);
    }
    this->dirty_ = false;
  }
  if (handle != 0) {
    puVar3 = (this->freeList_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar4 = (this->freeList_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar7 = (long)puVar4 - (long)puVar3 >> 3;
    while (puVar6 = puVar3, 0 < (long)uVar7) {
      uVar8 = uVar7 >> 1;
      uVar7 = ~uVar8 + uVar7;
      puVar3 = puVar6 + uVar8 + 1;
      if (handle <= puVar6[uVar8]) {
        puVar3 = puVar6;
        uVar7 = uVar8;
      }
    }
    if ((puVar6 == puVar4) || (handle < *puVar6)) {
      return handle < this->counter_;
    }
  }
  return false;
}

Assistant:

bool Has(const T handle) const {
    if (dirty_) {
      std::sort(freeList_.begin(), freeList_.end());
      dirty_ = false;
    }

    if (handle < 1) {
      return false;
    }

    // Do binary search.
    if (std::binary_search(freeList_.begin(), freeList_.end(), handle)) {
      return false;
    }

    if (handle >= counter_) {
      return false;
    }

    return true;
  }